

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sub_string.cpp
# Opt level: O1

bool __thiscall sub_string::try_drop_prefix(sub_string *this,sub_string other)

{
  char *__s2;
  int iVar1;
  char *__s1;
  ulong uVar2;
  ulong __n;
  bool bVar3;
  
  __s1 = other.begin_;
  __s2 = this->begin_;
  uVar2 = (long)this->end_ - (long)__s2;
  __n = (long)other.end_ - (long)__s1;
  if (uVar2 < __n) {
    bVar3 = false;
  }
  else if (other.end_ == __s1) {
    bVar3 = true;
  }
  else {
    iVar1 = bcmp(__s1,__s2,__n);
    bVar3 = iVar1 == 0;
  }
  if (bVar3 != false) {
    if (uVar2 < __n) {
      __assert_fail("i <= size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/sorokin[P]echo/sub_string.cpp"
                    ,0x15,"void sub_string::advance(size_t)");
    }
    this->begin_ = __s2 + __n;
  }
  return bVar3;
}

Assistant:

bool sub_string::try_drop_prefix(sub_string other)
{
    if (has_prefix(other))
    {
        advance(other.size());
        return true;
    }
    return false;
}